

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O3

int dwarf_debug_addr_index_to_addr
              (Dwarf_Die die,Dwarf_Unsigned index,Dwarf_Addr *return_addr,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict context;
  Dwarf_Debug dbg;
  int iVar1;
  Dwarf_Signed errval;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    context = die->di_cu_context;
    if (context != (Dwarf_CU_Context_conflict)0x0) {
      dbg = context->cc_dbg;
      if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
        iVar1 = _dwarf_look_in_local_and_tied_by_index(dbg,context,index,return_addr,error);
        return iVar1;
      }
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      return 1;
    }
    errval = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_debug_addr_index_to_addr(Dwarf_Die die,
    Dwarf_Unsigned index,
    Dwarf_Addr  *return_addr,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_CU_Context context = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    context = die->di_cu_context;
    dbg = context->cc_dbg;

    /* error is returned on dbg, not tieddbg. */
    res = _dwarf_look_in_local_and_tied_by_index(dbg,
        context,
        index,
        return_addr,
        error);
    return res;
}